

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O1

cubeb_resampler *
cubeb_resampler_create_internal<short>
          (cubeb_stream *stream,cubeb_stream_params *input_params,cubeb_stream_params *output_params
          ,uint target_rate,cubeb_data_callback callback,void *user_ptr,
          cubeb_resampler_quality quality,cubeb_resampler_reclock reclock)

{
  uint32_t uVar1;
  delay_line<short> *pdVar2;
  cubeb_data_callback p_Var3;
  int iVar4;
  uint32_t uVar5;
  passthrough_resampler<short> *this;
  cubeb_resampler_speex_one_way<short> *this_00;
  cubeb_resampler_speex_one_way<short> *this_01;
  delay_line<short> *pdVar6;
  code *pcVar7;
  pointer *__ptr;
  uint32_t uVar8;
  bool bVar9;
  bool bVar10;
  unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> output_delay;
  delay_line<short> *local_58;
  delay_line<short> *local_50;
  cubeb_data_callback local_48;
  cubeb_stream *local_40;
  void *local_38;
  
  local_50 = (delay_line<short> *)0x0;
  local_58 = (delay_line<short> *)0x0;
  if (((((input_params == (cubeb_stream_params *)0x0) ||
        (output_params == (cubeb_stream_params *)0x0)) || (input_params->rate != target_rate)) ||
      (output_params->rate != target_rate)) &&
     (((output_params != (cubeb_stream_params *)0x0 || input_params == (cubeb_stream_params *)0x0 ||
       (input_params->rate != target_rate)) &&
      ((output_params == (cubeb_stream_params *)0x0 || input_params != (cubeb_stream_params *)0x0 ||
       (output_params->rate != target_rate)))))) {
    local_40 = stream;
    local_38 = user_ptr;
    if ((output_params == (cubeb_stream_params *)0x0) ||
       (uVar8 = output_params->rate, uVar8 == target_rate)) {
      this_00 = (cubeb_resampler_speex_one_way<short> *)0x0;
    }
    else {
      this_00 = (cubeb_resampler_speex_one_way<short> *)operator_new(0x58);
      iVar4 = -1;
      if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
        iVar4 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
      }
      cubeb_resampler_speex_one_way<short>::cubeb_resampler_speex_one_way
                (this_00,output_params->channels,target_rate,uVar8,iVar4);
    }
    local_48 = callback;
    if (input_params == (cubeb_stream_params *)0x0) {
      this_01 = (cubeb_resampler_speex_one_way<short> *)0x0;
    }
    else {
      uVar8 = input_params->rate;
      if (uVar8 == target_rate) {
        this_01 = (cubeb_resampler_speex_one_way<short> *)0x0;
      }
      else {
        this_01 = (cubeb_resampler_speex_one_way<short> *)operator_new(0x58);
        iVar4 = -1;
        if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
          iVar4 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
        }
        cubeb_resampler_speex_one_way<short>::cubeb_resampler_speex_one_way
                  (this_01,input_params->channels,uVar8,target_rate,iVar4);
      }
    }
    if ((((this_01 == (cubeb_resampler_speex_one_way<short> *)0x0) ||
         (output_params == (cubeb_stream_params *)0x0)) ||
        (input_params == (cubeb_stream_params *)0x0)) ||
       (this_00 != (cubeb_resampler_speex_one_way<short> *)0x0)) {
      if (((this_00 != (cubeb_resampler_speex_one_way<short> *)0x0) &&
          (output_params != (cubeb_stream_params *)0x0)) &&
         ((input_params != (cubeb_stream_params *)0x0 &&
          (this_01 == (cubeb_resampler_speex_one_way<short> *)0x0)))) {
        pdVar6 = (delay_line<short> *)operator_new(0x48);
        iVar4 = speex_resampler_get_output_latency(this_00->speex_resampler);
        uVar5 = iVar4 + this_00->additional_latency;
        uVar8 = input_params->channels;
        uVar1 = output_params->rate;
        (pdVar6->super_processor).channels = uVar8;
        pdVar6->length = uVar5;
        pdVar6->leftover_samples = 0;
        (pdVar6->delay_output_buffer).capacity_ = 0;
        (pdVar6->delay_output_buffer).length_ = 0;
        (pdVar6->delay_input_buffer).length_ = 0;
        (pdVar6->delay_output_buffer).data_ = (short *)0x0;
        (pdVar6->delay_input_buffer).data_ = (short *)0x0;
        (pdVar6->delay_input_buffer).capacity_ = 0;
        pdVar6->sample_rate = uVar1;
        auto_array<short>::push_silence(&pdVar6->delay_input_buffer,(ulong)(uVar8 * uVar5));
        pdVar2 = local_50;
        bVar9 = local_50 != (delay_line<short> *)0x0;
        local_50 = pdVar6;
        if (bVar9) {
          std::default_delete<delay_line<short>_>::operator()
                    ((default_delete<delay_line<short>_> *)&local_50,pdVar2);
          pdVar6 = local_50;
        }
        goto LAB_0010fa9b;
      }
    }
    else {
      pdVar6 = (delay_line<short> *)operator_new(0x48);
      iVar4 = speex_resampler_get_output_latency(this_01->speex_resampler);
      uVar5 = iVar4 + this_01->additional_latency;
      uVar8 = output_params->rate;
      uVar1 = output_params->channels;
      (pdVar6->super_processor).channels = uVar1;
      pdVar6->length = uVar5;
      pdVar6->leftover_samples = 0;
      (pdVar6->delay_output_buffer).capacity_ = 0;
      (pdVar6->delay_output_buffer).length_ = 0;
      (pdVar6->delay_input_buffer).length_ = 0;
      (pdVar6->delay_output_buffer).data_ = (short *)0x0;
      (pdVar6->delay_input_buffer).data_ = (short *)0x0;
      (pdVar6->delay_input_buffer).capacity_ = 0;
      pdVar6->sample_rate = uVar8;
      auto_array<short>::push_silence(&pdVar6->delay_input_buffer,(ulong)(uVar1 * uVar5));
      pdVar2 = local_58;
      bVar9 = local_58 != (delay_line<short> *)0x0;
      local_58 = pdVar6;
      if (bVar9) {
        std::default_delete<delay_line<short>_>::operator()
                  ((default_delete<delay_line<short>_> *)&local_58,pdVar2);
        pdVar6 = local_58;
      }
LAB_0010fa9b:
      if (pdVar6 == (delay_line<short> *)0x0) {
        this = (passthrough_resampler<short> *)0x0;
        goto LAB_0010fb54;
      }
    }
    p_Var3 = local_48;
    bVar10 = g_cubeb_log_callback != (cubeb_log_callback)0x0;
    bVar9 = 0 < (int)g_cubeb_log_level;
    if (this_00 != (cubeb_resampler_speex_one_way<short> *)0x0 &&
        this_01 != (cubeb_resampler_speex_one_way<short> *)0x0) {
      if (bVar9 && bVar10) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Resampling input (%d) and output (%d) to target rate of %dHz\n",
                   "cubeb_resampler_internal.h",0x236,(ulong)input_params->rate,
                   (ulong)output_params->rate,(ulong)target_rate);
      }
      this = (passthrough_resampler<short> *)operator_new(0x48);
      (this->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_00149118;
      *(cubeb_resampler_speex_one_way<short> **)&this->super_processor = this_01;
      this->stream = (cubeb_stream *)this_00;
      (this->internal_input_buffer).data_ = (short *)local_40;
      (this->internal_input_buffer).capacity_ = (size_t)p_Var3;
      (this->internal_input_buffer).length_ = (size_t)local_38;
      *(undefined1 *)&this->sample_rate = 0;
      this->data_callback =
           cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
           ::fill_internal_duplex;
      this->user_ptr = (void *)0x0;
      goto LAB_0010fb4f;
    }
    if (this_01 != (cubeb_resampler_speex_one_way<short> *)0x0) {
      if (bVar9 && bVar10) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Resampling input (%d) to target and output rate of %dHz\n",
                   "cubeb_resampler_internal.h",0x23d,(ulong)input_params->rate,(ulong)target_rate);
      }
      this = (passthrough_resampler<short> *)operator_new(0x48);
      pdVar6 = local_58;
      local_58 = (delay_line<short> *)0x0;
      (this->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_00149148;
      *(cubeb_resampler_speex_one_way<short> **)&this->super_processor = this_01;
      this->stream = (cubeb_stream *)pdVar6;
      (this->internal_input_buffer).data_ = (short *)local_40;
      (this->internal_input_buffer).capacity_ = (size_t)p_Var3;
      (this->internal_input_buffer).length_ = (size_t)local_38;
      *(undefined1 *)&this->sample_rate = 0;
      if (pdVar6 == (delay_line<short> *)0x0) {
        pcVar7 = cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>
                 ::fill_internal_input;
      }
      else {
        pcVar7 = cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>
                 ::fill_internal_duplex;
      }
      this->data_callback = pcVar7;
      this->user_ptr = (void *)0x0;
      this_01 = (cubeb_resampler_speex_one_way<short> *)0x0;
      goto LAB_0010fb54;
    }
    if (bVar9 && bVar10) {
      (*g_cubeb_log_callback)
                ("%s:%d: Resampling output (%dHz) to target and input rate of %dHz\n",
                 "cubeb_resampler_internal.h",0x244,(ulong)output_params->rate,(ulong)target_rate);
    }
    this = (passthrough_resampler<short> *)operator_new(0x48);
    pdVar6 = local_50;
    local_50 = (delay_line<short> *)0x0;
    (this->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_00149178;
    *(delay_line<short> **)&this->super_processor = pdVar6;
    this->stream = (cubeb_stream *)this_00;
    (this->internal_input_buffer).data_ = (short *)local_40;
    (this->internal_input_buffer).capacity_ = (size_t)p_Var3;
    (this->internal_input_buffer).length_ = (size_t)local_38;
    *(undefined1 *)&this->sample_rate = 0;
    if (this_00 == (cubeb_resampler_speex_one_way<short> *)0x0 || pdVar6 == (delay_line<short> *)0x0
       ) {
      if (pdVar6 != (delay_line<short> *)0x0) {
        pcVar7 = cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>
                 ::fill_internal_input;
        goto LAB_0010fcf4;
      }
      if (this_00 != (cubeb_resampler_speex_one_way<short> *)0x0) {
        pcVar7 = cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>
                 ::fill_internal_output;
        goto LAB_0010fcf4;
      }
    }
    else {
      pcVar7 = cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>
               ::fill_internal_duplex;
LAB_0010fcf4:
      this->data_callback = pcVar7;
      this->user_ptr = (void *)0x0;
    }
  }
  else {
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: Input and output sample-rate match, target rate of %dHz\n",
                 "cubeb_resampler_internal.h",0x206,(ulong)target_rate);
    }
    this = (passthrough_resampler<short> *)operator_new(0x48);
    if (input_params == (cubeb_stream_params *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = input_params->channels;
    }
    passthrough_resampler<short>::passthrough_resampler
              (this,stream,callback,user_ptr,uVar8,target_rate);
LAB_0010fb4f:
    this_01 = (cubeb_resampler_speex_one_way<short> *)0x0;
  }
  this_00 = (cubeb_resampler_speex_one_way<short> *)0x0;
LAB_0010fb54:
  if (local_58 != (delay_line<short> *)0x0) {
    std::default_delete<delay_line<short>_>::operator()
              ((default_delete<delay_line<short>_> *)&local_58,local_58);
  }
  if (local_50 != (delay_line<short> *)0x0) {
    std::default_delete<delay_line<short>_>::operator()
              ((default_delete<delay_line<short>_> *)&local_50,local_50);
  }
  if (this_00 != (cubeb_resampler_speex_one_way<short> *)0x0) {
    (*(code *)((cubeb *)this_00->_vptr_cubeb_resampler_speex_one_way)[1].ops)(this_00);
  }
  if (this_01 != (cubeb_resampler_speex_one_way<short> *)0x0) {
    (*this_01->_vptr_cubeb_resampler_speex_one_way[1])(this_01);
  }
  return &this->super_cubeb_resampler;
}

Assistant:

cubeb_resampler *
cubeb_resampler_create_internal(cubeb_stream * stream,
                                cubeb_stream_params * input_params,
                                cubeb_stream_params * output_params,
                                unsigned int target_rate,
                                cubeb_data_callback callback, void * user_ptr,
                                cubeb_resampler_quality quality,
                                cubeb_resampler_reclock reclock)
{
  std::unique_ptr<cubeb_resampler_speex_one_way<T>> input_resampler = nullptr;
  std::unique_ptr<cubeb_resampler_speex_one_way<T>> output_resampler = nullptr;
  std::unique_ptr<delay_line<T>> input_delay = nullptr;
  std::unique_ptr<delay_line<T>> output_delay = nullptr;

  assert((input_params || output_params) &&
         "need at least one valid parameter pointer.");

  /* All the streams we have have a sample rate that matches the target
     sample rate, use a no-op resampler, that simply forwards the buffers to the
     callback. */
  if (((input_params && input_params->rate == target_rate) &&
       (output_params && output_params->rate == target_rate)) ||
      (input_params && !output_params && (input_params->rate == target_rate)) ||
      (output_params && !input_params &&
       (output_params->rate == target_rate))) {
    LOG("Input and output sample-rate match, target rate of %dHz", target_rate);
    return new passthrough_resampler<T>(
        stream, callback, user_ptr, input_params ? input_params->channels : 0,
        target_rate);
  }

  /* Determine if we need to resampler one or both directions, and create the
     resamplers. */
  if (output_params && (output_params->rate != target_rate)) {
    output_resampler.reset(new cubeb_resampler_speex_one_way<T>(
        output_params->channels, target_rate, output_params->rate,
        to_speex_quality(quality)));
    if (!output_resampler) {
      return NULL;
    }
  }

  if (input_params && (input_params->rate != target_rate)) {
    input_resampler.reset(new cubeb_resampler_speex_one_way<T>(
        input_params->channels, input_params->rate, target_rate,
        to_speex_quality(quality)));
    if (!input_resampler) {
      return NULL;
    }
  }

  /* If we resample only one direction but we have a duplex stream, insert a
   * delay line with a length equal to the resampler latency of the
   * other direction so that the streams are synchronized. */
  if (input_resampler && !output_resampler && input_params && output_params) {
    output_delay.reset(new delay_line<T>(input_resampler->latency(),
                                         output_params->channels,
                                         output_params->rate));
    if (!output_delay) {
      return NULL;
    }
  } else if (output_resampler && !input_resampler && input_params &&
             output_params) {
    input_delay.reset(new delay_line<T>(output_resampler->latency(),
                                        input_params->channels,
                                        output_params->rate));
    if (!input_delay) {
      return NULL;
    }
  }

  if (input_resampler && output_resampler) {
    LOG("Resampling input (%d) and output (%d) to target rate of %dHz",
        input_params->rate, output_params->rate, target_rate);
    return new cubeb_resampler_speex<T, cubeb_resampler_speex_one_way<T>,
                                     cubeb_resampler_speex_one_way<T>>(
        input_resampler.release(), output_resampler.release(), stream, callback,
        user_ptr);
  } else if (input_resampler) {
    LOG("Resampling input (%d) to target and output rate of %dHz",
        input_params->rate, target_rate);
    return new cubeb_resampler_speex<T, cubeb_resampler_speex_one_way<T>,
                                     delay_line<T>>(input_resampler.release(),
                                                    output_delay.release(),
                                                    stream, callback, user_ptr);
  } else {
    LOG("Resampling output (%dHz) to target and input rate of %dHz",
        output_params->rate, target_rate);
    return new cubeb_resampler_speex<T, delay_line<T>,
                                     cubeb_resampler_speex_one_way<T>>(
        input_delay.release(), output_resampler.release(), stream, callback,
        user_ptr);
  }
}